

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack1to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  undefined1 *puVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  long lVar22;
  undefined1 (*pauVar23) [16];
  uint uVar24;
  size_t _elemsize;
  long lVar25;
  ulong *puVar26;
  long lVar27;
  long lVar28;
  undefined1 (*pauVar29) [16];
  int iVar30;
  undefined1 *puVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar38 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long local_d8;
  undefined1 local_a8 [64];
  size_t local_68;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  Mat *local_38;
  
  uVar1 = bottom_im2col->w;
  iVar33 = bottom_im2col->h;
  uVar24 = bottom_im2col->c;
  lVar34 = (long)(int)uVar24;
  local_58 = (ulong)(uint)top_blob->c;
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar11 = uVar1;
  iVar19 = iVar33;
  if (lVar34 < 4) {
    uVar14 = uVar24;
    if ((int)uVar1 < 4) {
      iVar30 = 1;
      _elemsize = 1;
      if ((int)uVar1 < 2) goto LAB_0024fb07;
      iVar19 = iVar33 * 2;
      uVar11 = (uVar1 & 1) + 1;
    }
    else {
      uVar11 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
      iVar19 = iVar33 * 4;
    }
    iVar30 = 1;
    _elemsize = 1;
  }
  else {
    if ((int)uVar1 < 4) {
      if ((int)uVar1 < 2) {
        iVar30 = 4;
        _elemsize = 4;
        uVar14 = (uVar24 & 3) + (uVar24 >> 2);
        goto LAB_0024fb07;
      }
      iVar19 = iVar33 * 2;
      uVar14 = (uVar24 & 3) + (uVar24 >> 2);
      uVar11 = (uVar1 & 1) + 1;
    }
    else {
      iVar19 = iVar33 * 4;
      uVar14 = (uVar24 & 3) + (uVar24 >> 2);
      uVar11 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
    iVar30 = 4;
    _elemsize = 4;
  }
LAB_0024fb07:
  local_38 = top_blob;
  Mat::create((Mat *)local_a8,iVar19,uVar14,uVar11,_elemsize,iVar30,opt->workspace_allocator);
  uVar17 = (ulong)uVar24;
  uVar10 = (ulong)(int)uVar1;
  uVar11 = (int)uVar1 >> 2;
  if (0 < (int)uVar11) {
    local_50 = (ulong)uVar11;
    local_d8 = 3;
    lVar27 = 1;
    uVar36 = 0;
    do {
      puVar31 = (undefined1 *)(local_68 * uVar36 * local_a8._16_8_ + local_a8._0_8_);
      if ((int)uVar24 < 4) {
        uVar16 = 0;
      }
      else {
        lVar32 = 3;
        lVar15 = 2;
        lVar35 = 1;
        uVar20 = 0;
        do {
          if (0 < iVar33) {
            lVar25 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar18 = lVar25 * lVar32;
            lVar22 = (long)bottom_im2col->data + local_d8;
            lVar28 = lVar25 * lVar15;
            lVar12 = lVar25 * uVar20;
            lVar25 = lVar25 * lVar35;
            iVar19 = iVar33;
            do {
              *puVar31 = *(undefined1 *)(lVar22 + -3 + lVar12);
              puVar31[1] = *(undefined1 *)(lVar22 + -3 + lVar25);
              puVar31[2] = *(undefined1 *)(lVar22 + -3 + lVar28);
              puVar31[3] = *(undefined1 *)(lVar22 + -3 + lVar18);
              puVar31[4] = *(undefined1 *)(lVar22 + -2 + lVar12);
              puVar31[5] = *(undefined1 *)(lVar22 + -2 + lVar25);
              puVar31[6] = *(undefined1 *)(lVar22 + -2 + lVar28);
              puVar31[7] = *(undefined1 *)(lVar22 + -2 + lVar18);
              puVar31[8] = *(undefined1 *)(lVar22 + -1 + lVar12);
              puVar31[9] = *(undefined1 *)(lVar22 + -1 + lVar25);
              puVar31[10] = *(undefined1 *)(lVar22 + -1 + lVar28);
              puVar31[0xb] = *(undefined1 *)(lVar22 + -1 + lVar18);
              puVar31[0xc] = *(undefined1 *)(lVar22 + lVar12);
              puVar31[0xd] = *(undefined1 *)(lVar22 + lVar25);
              puVar31[0xe] = *(undefined1 *)(lVar22 + lVar28);
              puVar31[0xf] = *(undefined1 *)(lVar22 + lVar18);
              puVar31 = puVar31 + 0x10;
              lVar22 = lVar22 + (ulong)uVar1;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          uVar16 = uVar20 + 4;
          lVar12 = uVar20 + 7;
          lVar32 = lVar32 + 4;
          lVar15 = lVar15 + 4;
          lVar35 = lVar35 + 4;
          uVar20 = uVar16;
          local_48 = uVar36;
          local_40 = lVar27;
        } while (lVar12 < lVar34);
      }
      if ((int)uVar16 < (int)uVar24) {
        uVar16 = uVar16 & 0xffffffff;
        do {
          if (0 < iVar33) {
            puVar13 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar16 + lVar27);
            iVar19 = iVar33;
            do {
              *puVar31 = puVar13[-1];
              puVar31[1] = *puVar13;
              puVar31[2] = puVar13[1];
              puVar31[3] = puVar13[2];
              puVar31 = puVar31 + 4;
              puVar13 = puVar13 + uVar1;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar17);
      }
      uVar36 = uVar36 + 1;
      local_d8 = local_d8 + 4;
      lVar27 = lVar27 + 4;
    } while (uVar36 != local_50);
  }
  uVar36 = uVar10 & 0xfffffffffffffffc;
  uVar14 = uVar1 >> 1 & 1;
  if (uVar14 != 0) {
    puVar31 = (undefined1 *)((long)(int)uVar11 * local_68 * local_a8._16_8_ + local_a8._0_8_);
    uVar16 = 0;
    if (3 < (int)uVar24) {
      lVar27 = 1;
      lVar15 = 2;
      lVar32 = 3;
      uVar20 = 0;
      do {
        if (0 < iVar33) {
          pvVar2 = bottom_im2col->data;
          lVar18 = bottom_im2col->elemsize * bottom_im2col->cstep;
          lVar35 = (long)pvVar2 + lVar18 * uVar20 + 1;
          lVar22 = (long)pvVar2 + lVar18 * lVar27 + 1;
          lVar12 = (long)pvVar2 + lVar18 * lVar15 + 1;
          lVar18 = (long)pvVar2 + lVar18 * lVar32 + 1;
          iVar19 = iVar33;
          do {
            *puVar31 = *(undefined1 *)(lVar35 + -1 + uVar36);
            puVar31[1] = *(undefined1 *)(lVar22 + -1 + uVar36);
            puVar31[2] = *(undefined1 *)(lVar12 + -1 + uVar36);
            puVar31[3] = *(undefined1 *)(lVar18 + -1 + uVar36);
            puVar31[4] = *(undefined1 *)(lVar35 + uVar36);
            puVar31[5] = *(undefined1 *)(lVar22 + uVar36);
            puVar31[6] = *(undefined1 *)(lVar12 + uVar36);
            puVar31[7] = *(undefined1 *)(lVar18 + uVar36);
            puVar31 = puVar31 + 8;
            lVar35 = lVar35 + uVar10;
            lVar22 = lVar22 + uVar10;
            lVar12 = lVar12 + uVar10;
            lVar18 = lVar18 + uVar10;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
        }
        uVar16 = uVar20 + 4;
        lVar35 = uVar20 + 7;
        lVar27 = lVar27 + 4;
        lVar15 = lVar15 + 4;
        lVar32 = lVar32 + 4;
        uVar20 = uVar16;
      } while (lVar35 < lVar34);
    }
    if ((int)uVar16 < (int)uVar24) {
      uVar16 = uVar16 & 0xffffffff;
      do {
        if (0 < iVar33) {
          puVar13 = (undefined1 *)
                    ((long)bottom_im2col->data +
                    bottom_im2col->cstep * bottom_im2col->elemsize * uVar16 + uVar36 + 1);
          iVar19 = iVar33;
          do {
            *puVar31 = puVar13[-1];
            puVar31[1] = *puVar13;
            puVar31 = puVar31 + 2;
            puVar13 = puVar13 + uVar10;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar17);
    }
  }
  iVar19 = (int)uVar36 + uVar14 * 2;
  if (iVar19 < (int)uVar1) {
    uVar36 = (ulong)iVar19;
    do {
      iVar19 = (int)uVar36;
      iVar30 = iVar19 + 3;
      if (-1 < iVar19) {
        iVar30 = iVar19;
      }
      puVar31 = (undefined1 *)
                (local_a8._16_8_ * local_68 *
                 (long)(int)((iVar19 - (((uint)(uVar36 >> 0x1f) & 1) + iVar19 & 0xfffffffe)) +
                             (iVar30 >> 2) +
                            (int)((char)((char)uVar36 - ((byte)iVar30 & 0xfc)) / '\x02')) +
                local_a8._0_8_);
      if ((int)uVar24 < 4) {
        uVar16 = 0;
      }
      else {
        lVar27 = 1;
        lVar15 = 2;
        lVar32 = 3;
        uVar20 = 0;
        do {
          if (0 < iVar33) {
            lVar35 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar12 = (long)bottom_im2col->data + uVar36;
            iVar19 = iVar33;
            do {
              *puVar31 = *(undefined1 *)(lVar12 + lVar35 * uVar20);
              puVar31[1] = *(undefined1 *)(lVar12 + lVar35 * lVar27);
              puVar31[2] = *(undefined1 *)(lVar12 + lVar35 * lVar15);
              puVar31[3] = *(undefined1 *)(lVar12 + lVar35 * lVar32);
              puVar31 = puVar31 + 4;
              lVar12 = lVar12 + uVar10;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          uVar16 = uVar20 + 4;
          lVar35 = uVar20 + 7;
          lVar27 = lVar27 + 4;
          lVar15 = lVar15 + 4;
          lVar32 = lVar32 + 4;
          uVar20 = uVar16;
        } while (lVar35 < lVar34);
      }
      if ((int)uVar16 < (int)uVar24) {
        uVar16 = uVar16 & 0xffffffff;
        do {
          if (0 < iVar33) {
            puVar13 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar36 + bottom_im2col->cstep * uVar16 * bottom_im2col->elemsize);
            iVar19 = iVar33;
            do {
              *puVar31 = *puVar13;
              puVar31 = puVar31 + 1;
              puVar13 = puVar13 + uVar10;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar17);
      }
      uVar36 = uVar36 + 1;
    } while (uVar36 != uVar10);
  }
  if (0 < (int)local_58) {
    uVar11 = uVar24 + 3;
    if (-1 < (int)uVar24) {
      uVar11 = uVar24;
    }
    iVar19 = ((int)uVar11 >> 2) * iVar33;
    iVar33 = ((int)uVar24 % 4) * iVar33;
    uVar17 = 0;
    do {
      pauVar21 = (undefined1 (*) [16])
                 (local_38->cstep * uVar17 * local_38->elemsize + (long)local_38->data);
      if ((int)uVar1 < 4) {
        uVar36 = 0;
      }
      else {
        uVar16 = 0;
        do {
          pauVar23 = (undefined1 (*) [16])
                     ((uVar16 >> 2) * local_68 * local_a8._16_8_ + local_a8._0_8_);
          pauVar29 = (undefined1 (*) [16])
                     (kernel->cstep * uVar17 * kernel->elemsize + (long)kernel->data);
          auVar38 = ZEXT1664((undefined1  [16])0x0);
          if (iVar19 < 1) {
            auVar42 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            auVar43 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            iVar30 = iVar19;
            do {
              auVar3 = vpmovsxbw_avx2(*pauVar23);
              auVar5 = vpermq_avx2(auVar3,0x50);
              auVar6 = vpermq_avx2(auVar3,0xfa);
              auVar4 = vpmovsxbw_avx2(*pauVar29);
              auVar7 = vpermq_avx2(auVar3,5);
              auVar8 = vpermq_avx2(auVar3,0xaf);
              auVar3 = vpmaddwd_avx2(auVar4,auVar5);
              auVar3 = vpaddd_avx2(auVar3,auVar38._0_32_);
              auVar38 = ZEXT3264(auVar3);
              auVar5 = vpmaddwd_avx2(auVar7,auVar4);
              auVar5 = vpaddd_avx2(auVar5,auVar43._0_32_);
              auVar43 = ZEXT3264(auVar5);
              auVar6 = vpmaddwd_avx2(auVar4,auVar6);
              auVar6 = vpaddd_avx2(auVar6,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar6);
              auVar4 = vpmaddwd_avx2(auVar4,auVar8);
              auVar4 = vpaddd_avx2(auVar4,auVar45._0_32_);
              auVar45 = ZEXT3264(auVar4);
              pauVar23 = pauVar23 + 1;
              pauVar29 = pauVar29 + 1;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            auVar3 = vphaddd_avx2(auVar3,auVar5);
            auVar5 = vphaddd_avx2(auVar6,auVar4);
            auVar3 = vpermq_avx2(auVar3,0x9c);
            auVar42 = ZEXT3264(auVar3);
            auVar3 = vpermq_avx2(auVar5,0x9c);
            auVar38 = ZEXT3264(auVar3);
          }
          auVar37 = auVar38._0_16_;
          auVar47 = auVar42._0_16_;
          auVar40 = auVar42._16_16_;
          auVar39 = auVar38._16_16_;
          if (0 < iVar33) {
            lVar34 = 0;
            do {
              auVar47 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar23 + lVar34 * 4)));
              auVar47 = vpshuflw_avx(auVar47,0x50);
              auVar37 = vpshufd_avx(auVar47,0x50);
              auVar47 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar23 + lVar34 * 4 + 2)));
              auVar47 = vpshuflw_avx(auVar47,0x50);
              auVar41 = vpshufd_avx(auVar47,0x50);
              auVar47 = vpmovsxbw_avx(ZEXT416(*(uint *)(*pauVar29 + lVar34 * 4)));
              auVar47._8_8_ = auVar47._0_8_;
              auVar44 = vpmullw_avx(auVar47,auVar37);
              auVar37 = vpmulhw_avx(auVar37,auVar47);
              auVar46 = vpmullw_avx(auVar47,auVar41);
              auVar41 = vpmulhw_avx(auVar41,auVar47);
              auVar47 = vpunpcklwd_avx(auVar44,auVar37);
              auVar47 = vpaddd_avx(auVar42._0_16_,auVar47);
              auVar42 = ZEXT1664(auVar47);
              auVar37 = vpunpckhwd_avx(auVar44,auVar37);
              auVar40 = vpaddd_avx(auVar40,auVar37);
              auVar37 = vpunpcklwd_avx(auVar46,auVar41);
              auVar37 = vpaddd_avx(auVar38._0_16_,auVar37);
              auVar38 = ZEXT1664(auVar37);
              auVar41 = vpunpckhwd_avx(auVar46,auVar41);
              auVar39 = vpaddd_avx(auVar39,auVar41);
              lVar34 = lVar34 + 1;
            } while (iVar33 != (int)lVar34);
          }
          *pauVar21 = auVar47;
          pauVar21[1] = auVar40;
          pauVar21[2] = auVar37;
          pauVar21[3] = auVar39;
          pauVar21 = pauVar21 + 4;
          uVar36 = uVar16 + 4;
          lVar34 = uVar16 + 7;
          uVar16 = uVar36;
        } while (lVar34 < (long)uVar10);
      }
      uVar24 = (uint)uVar36 | 1;
      while (uVar11 = (uint)uVar36, (int)uVar24 < (int)uVar1) {
        pauVar23 = (undefined1 (*) [16])
                   (local_a8._16_8_ * local_68 *
                    (ulong)(((uint)(uVar36 >> 2) & 0x3fffffff) + (uint)((uVar11 >> 1 & 1) != 0)) +
                   local_a8._0_8_);
        pauVar29 = (undefined1 (*) [16])
                   (kernel->cstep * uVar17 * kernel->elemsize + (long)kernel->data);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        if (0 < iVar19) {
          auVar42 = ZEXT1664((undefined1  [16])0x0);
          iVar30 = iVar19;
          do {
            auVar3 = vpmovsxbw_avx2(*pauVar23);
            auVar6 = vpermq_avx2(auVar3,0x50);
            auVar5 = vpmovsxbw_avx2(*pauVar29);
            auVar4 = vpermq_avx2(auVar3,5);
            auVar3 = vpmaddwd_avx2(auVar6,auVar5);
            auVar3 = vpaddd_avx2(auVar3,auVar42._0_32_);
            auVar42 = ZEXT3264(auVar3);
            auVar5 = vpmaddwd_avx2(auVar4,auVar5);
            auVar5 = vpaddd_avx2(auVar5,auVar38._0_32_);
            auVar38 = ZEXT3264(auVar5);
            pauVar23 = (undefined1 (*) [16])(*pauVar23 + 8);
            pauVar29 = pauVar29 + 1;
            iVar30 = iVar30 + -1;
          } while (iVar30 != 0);
          auVar3 = vphaddd_avx2(auVar3,auVar5);
          auVar3 = vpermq_avx2(auVar3,0x9c);
          auVar38 = ZEXT3264(auVar3);
        }
        auVar47 = auVar38._0_16_;
        auVar40 = auVar38._16_16_;
        if (0 < iVar33) {
          lVar34 = 0;
          do {
            auVar47 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar23 + lVar34 * 2)));
            auVar47 = vpshuflw_avx(auVar47,0x50);
            auVar41 = vpshufd_avx(auVar47,0x50);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)(*pauVar29 + lVar34 * 4);
            auVar47 = vpmovsxbw_avx(auVar37);
            auVar44._0_8_ = auVar47._0_8_;
            auVar44._8_8_ = auVar44._0_8_;
            auVar39 = vpmullw_avx(auVar41,auVar44);
            auVar37 = vpmulhw_avx(auVar41,auVar44);
            auVar47 = vpunpcklwd_avx(auVar39,auVar37);
            auVar47 = vpaddd_avx(auVar38._0_16_,auVar47);
            auVar38 = ZEXT1664(auVar47);
            auVar37 = vpunpckhwd_avx(auVar39,auVar37);
            auVar40 = vpaddd_avx(auVar40,auVar37);
            lVar34 = lVar34 + 1;
          } while (iVar33 != (int)lVar34);
        }
        *pauVar21 = auVar47;
        pauVar21[1] = auVar40;
        pauVar21 = pauVar21 + 2;
        uVar36 = (ulong)(uVar11 + 2);
        uVar24 = uVar11 + 3;
      }
      if ((int)uVar11 < (int)uVar1) {
        do {
          uVar24 = (uint)uVar36;
          puVar26 = (ulong *)(local_a8._16_8_ * local_68 *
                              (ulong)((uVar24 & 1) + ((uint)(uVar36 >> 2) & 0x3fffffff) +
                                     (uint)((uVar24 >> 1 & 1) != 0)) + local_a8._0_8_);
          pauVar23 = (undefined1 (*) [16])
                     (kernel->cstep * uVar17 * kernel->elemsize + (long)kernel->data);
          auVar38 = ZEXT1664((undefined1  [16])0x0);
          if (0 < iVar19) {
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            auVar43 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            iVar30 = iVar19;
            do {
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *puVar26;
              auVar37 = vpmovsxbw_avx(auVar40);
              auVar47 = *pauVar23;
              auVar40 = vpcmpgtb_avx((undefined1  [16])0x0,auVar47);
              auVar39 = vpunpcklbw_avx(auVar47,auVar40);
              auVar47 = vpunpckhbw_avx(auVar47,auVar40);
              auVar46._0_8_ = auVar37._0_8_;
              auVar46._8_8_ = auVar46._0_8_;
              auVar37 = vpmullw_avx(auVar39,auVar46);
              auVar40 = vpmulhw_avx(auVar39,auVar46);
              auVar41 = vpmullw_avx(auVar46,auVar47);
              auVar39 = vpmulhw_avx(auVar46,auVar47);
              auVar47 = vpunpcklwd_avx(auVar37,auVar40);
              auVar47 = vpaddd_avx(auVar45._0_16_,auVar47);
              auVar45 = ZEXT1664(auVar47);
              auVar40 = vpunpckhwd_avx(auVar37,auVar40);
              auVar40 = vpaddd_avx(auVar43._0_16_,auVar40);
              auVar43 = ZEXT1664(auVar40);
              auVar37 = vpunpcklwd_avx(auVar41,auVar39);
              auVar37 = vpaddd_avx(auVar42._0_16_,auVar37);
              auVar42 = ZEXT1664(auVar37);
              auVar39 = vpunpckhwd_avx(auVar41,auVar39);
              auVar39 = vpaddd_avx(auVar38._0_16_,auVar39);
              auVar38 = ZEXT1664(auVar39);
              puVar26 = (ulong *)((long)puVar26 + 4);
              pauVar23 = pauVar23 + 1;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            auVar41 = vpunpckldq_avx(auVar47,auVar40);
            auVar44 = vpunpckldq_avx(auVar37,auVar39);
            auVar40 = vpunpckhdq_avx(auVar47,auVar40);
            auVar37 = vpunpckhdq_avx(auVar37,auVar39);
            auVar39 = vpunpcklqdq_avx(auVar41,auVar44);
            auVar47 = vpunpckhqdq_avx(auVar41,auVar44);
            auVar47 = vpaddd_avx(auVar39,auVar47);
            auVar39 = vpunpcklqdq_avx(auVar40,auVar37);
            auVar40 = vpunpckhqdq_avx(auVar40,auVar37);
            auVar40 = vpaddd_avx(auVar40,auVar39);
            auVar47 = vpaddd_avx(auVar47,auVar40);
            auVar38 = ZEXT1664(auVar47);
          }
          auVar47 = auVar38._0_16_;
          if (0 < iVar33) {
            lVar34 = 0;
            do {
              auVar41._0_2_ = (short)*(char *)((long)puVar26 + lVar34);
              auVar41._2_2_ = auVar41._0_2_;
              auVar41._4_2_ = auVar41._0_2_;
              auVar41._6_2_ = auVar41._0_2_;
              auVar41._8_2_ = auVar41._0_2_;
              auVar41._10_2_ = auVar41._0_2_;
              auVar41._12_2_ = auVar41._0_2_;
              auVar41._14_2_ = auVar41._0_2_;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)(*pauVar23 + lVar34 * 4);
              auVar47 = vpmovsxbw_avx(auVar39);
              auVar40 = vpmullw_avx(auVar41,auVar47);
              auVar47 = vpmulhw_avx(auVar41,auVar47);
              auVar47 = vpunpcklwd_avx(auVar40,auVar47);
              auVar47 = vpaddd_avx(auVar38._0_16_,auVar47);
              auVar38 = ZEXT1664(auVar47);
              lVar34 = lVar34 + 1;
            } while (iVar33 != (int)lVar34);
          }
          *pauVar21 = auVar47;
          pauVar21 = pauVar21 + 1;
          uVar36 = (ulong)(uVar24 + 1);
        } while (uVar24 + 1 != uVar1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_58);
  }
  piVar9 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}